

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void minify_string(char **input,char **output)

{
  char **output_local;
  char **input_local;
  
  **output = **input;
  *input = *input + 1;
  *output = *output + 1;
  while( true ) {
    if (**input == '\0') {
      return;
    }
    **output = **input;
    if (**input == '\"') break;
    if ((**input == '\\') && ((*input)[1] == '\"')) {
      (*output)[1] = (*input)[1];
      *input = *input + 1;
      *output = *output + 1;
    }
    *input = *input + 1;
    *output = *output + 1;
  }
  **output = '\"';
  *input = *input + 1;
  *output = *output + 1;
  return;
}

Assistant:

static void minify_string(char **input, char **output) {
    (*output)[0] = (*input)[0];
    *input += static_strlen("\"");
    *output += static_strlen("\"");


    for (; (*input)[0] != '\0'; (void)++(*input), ++(*output)) {
        (*output)[0] = (*input)[0];

        if ((*input)[0] == '\"') {
            (*output)[0] = '\"';
            *input += static_strlen("\"");
            *output += static_strlen("\"");
            return;
        } else if (((*input)[0] == '\\') && ((*input)[1] == '\"')) {
            (*output)[1] = (*input)[1];
            *input += static_strlen("\"");
            *output += static_strlen("\"");
        }
    }
}